

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall
Fl_Help_View::hv_draw(Fl_Help_View *this,char *t,int x,int y,int entity_extra_length)

{
  Fl_Color c_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  double dVar6;
  int l;
  int f;
  int w_1;
  int w;
  Fl_Color c;
  int entity_extra_length_local;
  int y_local;
  int x_local;
  char *t_local;
  Fl_Help_View *this_local;
  
  if ((((selected == 0) || (current_view != this)) || (selection_last <= current_pos)) ||
     (current_pos < selection_first)) {
    fl_draw(t,x,y);
  }
  else {
    c_00 = fl_color();
    fl_color(hv_selection_color);
    dVar6 = fl_width(t);
    iVar1 = current_pos;
    f = (int)dVar6;
    sVar5 = strlen(t);
    if (iVar1 + (int)sVar5 < selection_last) {
      dVar6 = fl_width(0x20);
      f = (int)dVar6 + f;
    }
    iVar1 = fl_descent();
    iVar2 = fl_height();
    iVar3 = fl_height();
    fl_rectf(x,(y + iVar1) - iVar2,f,iVar3);
    fl_color(hv_selection_text_color);
    fl_draw(t,x,y);
    fl_color(c_00);
  }
  if (draw_mode != 0) {
    dVar6 = fl_width(t);
    iVar1 = mouse_y;
    if ((x <= mouse_x) && (mouse_x < x + (int)dVar6)) {
      iVar3 = fl_height();
      iVar4 = fl_descent();
      iVar2 = mouse_y;
      if (((y - iVar3) + iVar4 <= iVar1) &&
         (iVar3 = fl_descent(), iVar1 = current_pos, iVar2 <= y + iVar3)) {
        sVar5 = strlen(t);
        iVar2 = iVar1 + (int)sVar5;
        if (draw_mode == 1) {
          selection_push_first = iVar1;
          selection_push_last = iVar2;
        }
        else {
          selection_drag_first = iVar1;
          selection_drag_last = iVar2 + entity_extra_length;
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Help_View::hv_draw(const char *t, int x, int y, int entity_extra_length)
{
  if (selected && current_view==this && current_pos<selection_last && current_pos>=selection_first) {
    Fl_Color c = fl_color();
    fl_color(hv_selection_color);
    int w = (int)fl_width(t);
    if (current_pos+(int)strlen(t)<selection_last)
      w += (int)fl_width(' ');
    fl_rectf(x, y+fl_descent()-fl_height(), w, fl_height());
    fl_color(hv_selection_text_color);
    fl_draw(t, x, y);
    fl_color(c);
  } else {
    fl_draw(t, x, y);
  }
  if (draw_mode) {
    int w = (int)fl_width(t);
    if (mouse_x>=x && mouse_x<x+w) {
      if (mouse_y>=y-fl_height()+fl_descent()&&mouse_y<=y+fl_descent()) {
        int f = (int) current_pos;
        int l = (int) (f+strlen(t)); // use 'quote_char' to calculate the true length of the HTML string
        if (draw_mode==1) {
          selection_push_first = f;
          selection_push_last = l;
        } else {
          selection_drag_first = f;
          selection_drag_last = l + entity_extra_length;
        }
      }
    }
  }
}